

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O2

int run_helper_tcp4_echo_server(void)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  char *__ptr;
  size_t sStack_20;
  undefined1 auStack_18 [16];
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/echo-server.c"
            ,0xff,"0 == uv_ip4_addr(\"127.0.0.1\", port, &addr)");
    abort();
  }
  server = (uv_handle_t *)&tcpServer;
  serverType = TCP;
  iVar1 = uv_tcp_init(loop);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&tcpServer,auStack_18,0);
    if (iVar1 == 0) {
      iVar1 = uv_listen(&tcpServer,0x1000,on_connection);
      __stream = _stderr;
      if (iVar1 != 0) {
        uVar2 = uv_err_name(iVar1);
        fprintf(__stream,"Listen error %s\n",uVar2);
        return 1;
      }
      notify_parent_process();
      uv_run(loop,0);
      return 0;
    }
    __ptr = "Bind error\n";
    sStack_20 = 0xb;
  }
  else {
    __ptr = "Socket creation error\n";
    sStack_20 = 0x16;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  return 1;
}

Assistant:

HELPER_IMPL(tcp4_echo_server) {
  loop = uv_default_loop();

  if (tcp4_echo_start(TEST_PORT))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}